

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall video::selector<28,29>(video *this,context *ctx,token *token,opcode *op)

{
  bool bVar1;
  char **table_00;
  unsigned_long uVar2;
  optional<unsigned_long> oVar3;
  int local_84;
  token local_80;
  string_view local_58;
  _Storage<unsigned_long,_true> local_48;
  optional<unsigned_long> result;
  char **table;
  uint64_t type;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  table_00 = selector<28,_29>::bytes;
  if ((op->value >> 0x1d & 7) == 2) {
    table_00 = selector<28,_29>::shorts;
  }
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = table_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,".");
  oVar3 = find_in_table(token,table_00,local_58);
  local_48._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_48);
  if (bVar1) {
    context::tokenize(&local_80,ctx);
    memcpy(token,&local_80,0x24);
  }
  local_84 = 0;
  uVar2 = std::optional<unsigned_long>::value_or<int>
                    ((optional<unsigned_long> *)&local_48,&local_84);
  opcode::add_bits(op,uVar2 << 0x1c);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(selector)
    {
        static const char* bytes[] = {"B0", "B1", "B2", "B3", nullptr};
        static const char* shorts[] = {"H0", "H1", nullptr};

        const uint64_t type = (op.value >> type_address) & 0b111;
        const char* const* const table = type == 2 ? shorts : bytes;
        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(0) << address);
        return {};
    }